

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  string local_40;
  
  switch(other) {
  case nullValue:
    bVar4 = isNumeric(this);
    if (bVar4) {
      dVar5 = asDouble(this);
      bVar3 = 1;
      if ((dVar5 == 0.0) && (!NAN(dVar5))) goto LAB_004719c8;
    }
    cVar2 = this->field_0x8;
    if ((cVar2 == '\x05') && (bVar3 = 1, (this->value_).bool_ == false)) goto LAB_004719c8;
    cVar1 = cVar2;
    if (cVar2 == '\x04') {
      asString_abi_cxx11_(&local_40,this);
      bVar4 = std::operator==(&local_40,"");
      bVar3 = true;
      if (!bVar4) {
        cVar1 = this->field_0x8;
        goto LAB_00471920;
      }
    }
    else {
LAB_00471920:
      if (((cVar1 == '\a') || (cVar1 == '\x06')) &&
         ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        bVar3 = true;
      }
      else {
        bVar3 = cVar1 == '\0';
      }
      if (cVar2 != '\x04') goto LAB_004719c8;
    }
    std::__cxx11::string::~string((string *)&local_40);
    goto LAB_004719c8;
  case intValue:
    bVar4 = isInt(this);
    bVar3 = 1;
    if (bVar4) goto LAB_004719c8;
    cVar2 = this->field_0x8;
    if ((cVar2 == '\x03') && (dVar5 = (this->value_).real_, -2147483648.0 <= dVar5)) {
      dVar6 = 2147483647.0;
LAB_0047197e:
      bVar3 = 1;
      if (dVar5 <= dVar6) goto LAB_004719c8;
    }
    break;
  case uintValue:
    bVar4 = isUInt(this);
    bVar3 = 1;
    if (bVar4) goto LAB_004719c8;
    cVar2 = this->field_0x8;
    if ((cVar2 == '\x03') && (dVar5 = (this->value_).real_, 0.0 <= dVar5)) {
      dVar6 = 4294967295.0;
      goto LAB_0047197e;
    }
    break;
  case realValue:
  case booleanValue:
    bVar4 = isNumeric(this);
    bVar3 = 1;
    if (bVar4) goto LAB_004719c8;
    cVar2 = this->field_0x8;
    break;
  case stringValue:
    bVar4 = isNumeric(this);
    bVar3 = 1;
    if (!bVar4) {
      bVar3 = (byte)*(undefined2 *)&this->field_0x8;
      if (bVar3 < 6) {
        bVar3 = 0x31 >> (bVar3 & 0x1f);
      }
      else {
        bVar3 = 0;
      }
    }
    goto LAB_004719c8;
  case arrayValue:
    cVar2 = this->field_0x8;
    bVar4 = cVar2 == '\x06';
    goto LAB_004719bb;
  case objectValue:
    cVar2 = this->field_0x8;
    bVar4 = cVar2 == '\a';
    goto LAB_004719bb;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x2f1,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar4 = cVar2 == '\x05';
LAB_004719bb:
  bVar3 = cVar2 == '\0' | bVar4;
LAB_004719c8:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString() == "") ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}